

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

void __thiscall ADPlanner::costs_changed(ADPlanner *this,StateChangeQuery *stateChange)

{
  undefined8 uVar1;
  long *in_RSI;
  long *in_RDI;
  
  *(undefined1 *)(in_RDI[0xf] + 0x50) = 1;
  if (((*(byte *)(in_RDI[0xf] + 0x51) & 1) != 1) && (*(short *)(in_RDI[0xf] + 0x20) != 0)) {
    if ((*(byte *)(in_RDI + 0xe) & 1) == 0) {
      uVar1 = (**(code **)(*in_RSI + 0x10))();
      (**(code **)(*in_RDI + 0x1b8))(in_RDI,uVar1);
    }
    else {
      uVar1 = (**(code **)(*in_RSI + 0x18))();
      (**(code **)(*in_RDI + 0x1b8))(in_RDI,uVar1);
    }
  }
  return;
}

Assistant:

void ADPlanner::costs_changed(StateChangeQuery const & stateChange)
{
    //recompute f values
    pSearchStateSpace_->bReevaluatefvals = true;

    //no processing if no search efforts anyway
    if (pSearchStateSpace_->bReinitializeSearchStateSpace == true || pSearchStateSpace_->searchiteration == 0) return;

    if (bforwardsearch)
        Update_SearchSuccs_of_ChangedEdges(stateChange.getSuccessors());
    else
        Update_SearchSuccs_of_ChangedEdges(stateChange.getPredecessors());
}